

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                    *other)

{
  ostream *poVar1;
  ct_constant<6L> local_55 [21];
  string local_40 [39];
  ct_constant<1L> local_19;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
  *local_18;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
  *other_local;
  ostream *stream_local;
  
  local_18 = other;
  other_local = (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                 *)stream;
  poVar1 = std::operator<<(stream,"[");
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
  ::lhs(local_18);
  poVar1 = operator<<(poVar1,&local_19);
  op_div<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_40);
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
  ::rhs(local_18);
  poVar1 = operator<<(poVar1,local_55);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  return (ostream *)other_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }